

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  undefined8 *puVar1;
  short sVar2;
  ProfileId profileId;
  ProfileId arrayProfileId;
  Type ppvVar3;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  FunctionBody *pFVar4;
  InterpreterStackFrame *pIVar5;
  code *pcVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  Var pvVar12;
  undefined4 *puVar13;
  uint uVar14;
  Type __s;
  Type TVar15;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  Var stackArgs [8];
  Arguments local_78;
  Arguments local_68;
  Arguments local_58;
  undefined1 auStack_48 [8];
  Arguments outArgs;
  
  __s = (Type)&uStack_c8;
  if (((byte)this[0xd6] & 0x10) == 0) {
    OP_NewScObject_Impl<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>,false,false>
              (this,playout,0xffffffff,spreadIndices);
    return;
  }
  TVar15 = (Type)((ulong)(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                         ArgCount | 0x1000000);
  ppvVar3 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    outArgs.Values._4_4_ =
         (uint)(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Return;
    pvVar12 = *(Var *)(this + (ulong)(playout->
                                     super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                     ).Function * 8 + 0x160);
    uStack_d0 = 0xa96c2c;
    ValidateRegValue(this,pvVar12,false,true);
    uStack_d0 = 0xa96c50;
    local_58.Info = TVar15;
    local_58.Values = ppvVar3;
    pvVar12 = ProfilingHelpers::ProfiledNewScObjArray
                        (pvVar12,&local_58,*(ScriptFunction **)(this + 0x80),
                         *(ProfileId *)
                          &playout[1].
                           super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>,
                         *(ProfileId *)
                          ((long)&playout[1].
                                  super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                                  Return + 1));
    uVar14 = outArgs.Values._4_4_;
  }
  else {
    uStack_d0 = 0xa96b98;
    stackArgs[7] = (Var)TVar15;
    uVar9 = JavascriptFunction::GetSpreadSize
                      ((Arguments *)(stackArgs + 7),spreadIndices,*(ScriptContext **)(this + 0x78));
    outArgs.Info = (Type)0x0;
    uVar14 = (uVar9 & 0xffffff) + 0x1000000;
    auStack_48._4_4_ = 0;
    auStack_48._0_4_ = uVar14;
    if ((uVar9 & 0xffffff) < 9) {
      outArgs.Info = (Type)&uStack_c8;
      uStack_c8 = 0;
      stackArgs[0] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      __s = (Type)&uStack_c8;
    }
    else {
      uStack_d0 = 0xa96bd8;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,
                 (ulong)(uVar14 & 0xffffff) * 8 + 0xc00,*(ScriptContext **)(this + 0x78),(PVOID)0x0)
      ;
      uVar14 = (auStack_48._0_4_ & 0xffffff) * 8;
      lVar7 = -(ulong)(uVar14 + 0xf & 0xfffffff0);
      __s = (Type)((long)stackArgs + lVar7 + -8);
      outArgs.Info = __s;
      *(undefined8 *)((long)&uStack_d0 + lVar7) = 0xa96c00;
      memset((void *)__s,0,(ulong)uVar14);
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_78.Info = TVar15;
    local_78.Values = ppvVar3;
    *(undefined8 *)((long)__s + -8) = 0xa96c96;
    JavascriptFunction::SpreadArgs(&local_78,(Arguments *)auStack_48,spreadIndices,scriptContext);
    sVar2 = (playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).Return;
    pvVar12 = *(Var *)(this + (ulong)(playout->
                                     super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                     ).Function * 8 + 0x160);
    *(undefined8 *)((long)__s + -8) = 0xa96cba;
    ValidateRegValue(this,pvVar12,false,true);
    local_68.Info = (Type)auStack_48;
    local_68.Values = (Type)outArgs.Info;
    caller = *(ScriptFunction **)(this + 0x80);
    profileId = *(ProfileId *)
                 &playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>;
    arrayProfileId =
         *(ProfileId *)
          ((long)&playout[1].super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return
          + 1);
    *(undefined8 *)((long)__s + -8) = 0xa96cdf;
    pvVar12 = ProfilingHelpers::ProfiledNewScObjArray
                        (pvVar12,&local_68,caller,profileId,arrayProfileId);
    uVar14 = (int)sVar2;
  }
  *(undefined8 *)((long)__s + -8) = 0xa96ced;
  SetReg<unsigned_int>(this,uVar14,pvVar12);
  pFVar4 = *(FunctionBody **)(this + 0x88);
  puVar1 = (undefined8 *)
           (*(long *)(this + 0x30) +
           ~(ulong)(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                   ArgCount * 8);
  *(undefined8 **)(this + 0x30) = puVar1;
  *(undefined8 *)(this + 0x28) = *puVar1;
  *(undefined8 *)((long)__s + -8) = 0xa96d13;
  RVar10 = FunctionBody::GetLocalsCount(pFVar4);
  pIVar5 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar10 * 8 + 0x160 <= pIVar5) {
    pFVar4 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa96d3b;
    RVar10 = FunctionBody::GetLocalsCount(pFVar4);
    pFVar4 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa96d4d;
    RVar11 = FunctionBody::GetOutParamMaxDepth(pFVar4);
    if (pIVar5 < this + (ulong)RVar11 * 8 + (ulong)RVar10 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  *(undefined8 *)((long)__s + -8) = 0xa96d66;
  Throw::LogAssert();
  *(undefined8 *)((long)__s + -8) = 0xa96d76;
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar13 = 1;
  *(undefined8 *)((long)__s + -8) = 0xa96d9e;
  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar8) {
    *puVar13 = 0;
    return;
  }
  pcVar6 = (code *)invalidInstructionException();
  (*pcVar6)();
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }